

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

Matrix3d * Util::matPOW(Matrix3d *mat,int n)

{
  int in_EDX;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_RSI;
  Matrix3d *in_RDI;
  int i;
  Matrix3d *out;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffffb8;
  undefined4 local_18;
  
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_RSI,
             (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffffb8);
  for (local_18 = 1; local_18 < in_EDX; local_18 = local_18 + 1) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(in_RSI,in_stack_ffffffffffffffb8);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_RSI,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                *)in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

Eigen::Matrix3d matPOW(Eigen::Matrix3d mat, int n){

		//initialize
		Eigen::Matrix3d out = mat;

		//cycle
		for (int i = 1; i < n; ++i)	{
			out = out*mat;
		}

		return out;

	}